

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# block_splitter.cpp
# Opt level: O0

void RefineEntropyCodesCommand
               (uint16_t *data,size_t length,size_t stride,size_t num_histograms,
               HistogramCommand *histograms,HistogramCommand *tmp)

{
  ulong in_RCX;
  ulong in_RDX;
  size_t in_RSI;
  uint16_t *in_RDI;
  long in_R8;
  HistogramCommand *in_R9;
  size_t iter;
  uint32_t seed;
  size_t iters;
  size_t i;
  ulong local_68;
  uint32_t local_5c;
  ulong local_58;
  HistogramCommand *local_50;
  long local_48;
  ulong local_40;
  ulong local_38;
  size_t local_30;
  uint16_t *local_28;
  HistogramCommand *local_20;
  ulong local_18;
  long local_8;
  
  local_5c = 7;
  local_58 = (((in_RSI << 1) / in_RDX + in_RCX + 99) / in_RCX) * in_RCX;
  local_50 = in_R9;
  local_48 = in_R8;
  local_40 = in_RCX;
  local_38 = in_RDX;
  local_30 = in_RSI;
  local_28 = in_RDI;
  for (local_68 = 0; local_68 < local_58; local_68 = local_68 + 1) {
    local_20 = local_50;
    memset(local_50,0,0xb00);
    local_20->total_count_ = 0;
    local_20->bit_cost_ = INFINITY;
    RandomSampleCommand(&local_5c,local_28,local_30,local_38,local_50);
    local_8 = local_48 + (local_68 % local_40) * 0xb10;
    *(size_t *)(local_8 + 0xb00) = local_50->total_count_ + *(long *)(local_8 + 0xb00);
    for (local_18 = 0; local_18 < 0x2c0; local_18 = local_18 + 1) {
      *(uint32_t *)(local_8 + local_18 * 4) =
           local_50->data_[local_18] + *(int *)(local_8 + local_18 * 4);
    }
  }
  return;
}

Assistant:

static void FN(RefineEntropyCodes)(const DataType* data, size_t length,
                                   size_t stride,
                                   size_t num_histograms,
                                   HistogramType* histograms,
                                   HistogramType* tmp) {
  size_t iters =
      kIterMulForRefining * length / stride + kMinItersForRefining;
  uint32_t seed = 7;
  size_t iter;
  iters = ((iters + num_histograms - 1) / num_histograms) * num_histograms;
  for (iter = 0; iter < iters; ++iter) {
    FN(HistogramClear)(tmp);
    FN(RandomSample)(&seed, data, length, stride, tmp);
    FN(HistogramAddHistogram)(&histograms[iter % num_histograms], tmp);
  }
}